

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     UnaryFlatUpdateLoop<duckdb::StddevState,double,duckdb::VarSampOperation>
               (double *idata,AggregateInputData *aggr_input_data,StddevState *state,idx_t count,
               ValidityMask *mask)

{
  bool bVar1;
  unsigned_long in_RCX;
  AggregateInputData *in_RSI;
  ValidityMask *in_R8;
  idx_t start;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t *base_idx;
  AggregateUnaryInput input;
  double *in_stack_ffffffffffffff88;
  StddevState *in_stack_ffffffffffffff90;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff98;
  unsigned_long local_60;
  ulong local_58;
  ulong local_50;
  idx_t *local_48;
  AggregateUnaryInput local_40;
  unsigned_long local_20;
  
  local_20 = in_RCX;
  AggregateUnaryInput::AggregateUnaryInput(&local_40,in_RSI,in_R8);
  local_48 = &local_40.input_idx;
  local_40.input_idx = 0;
  local_50 = TemplatedValidityMask<unsigned_long>::EntryCount(0x817f75);
  for (local_58 = 0; local_58 < local_50; local_58 = local_58 + 1) {
    local_60 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                         (in_stack_ffffffffffffff98,(idx_t)in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff98 =
         (TemplatedValidityMask<unsigned_long> *)MinValue<unsigned_long>(*local_48 + 0x40,local_20);
    bVar1 = STDDevBaseOperation::IgnoreNull();
    if ((!bVar1) || (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_60), bVar1)) {
      while ((TemplatedValidityMask<unsigned_long> *)*local_48 < in_stack_ffffffffffffff98) {
        STDDevBaseOperation::Operation<double,duckdb::StddevState,duckdb::VarSampOperation>
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                   (AggregateUnaryInput *)0x818011);
        *local_48 = *local_48 + 1;
      }
    }
    else {
      bVar1 = TemplatedValidityMask<unsigned_long>::NoneValid(local_60);
      if (bVar1) {
        *local_48 = (idx_t)in_stack_ffffffffffffff98;
      }
      else {
        in_stack_ffffffffffffff90 = (StddevState *)*local_48;
        while ((TemplatedValidityMask<unsigned_long> *)*local_48 < in_stack_ffffffffffffff98) {
          in_stack_ffffffffffffff88 = (double *)(*local_48 - (long)in_stack_ffffffffffffff90);
          bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&local_60,(idx_t *)&stack0xffffffffffffff88);
          if (bVar1) {
            STDDevBaseOperation::Operation<double,duckdb::StddevState,duckdb::VarSampOperation>
                      (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                       (AggregateUnaryInput *)0x8180a9);
          }
          *local_48 = *local_48 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryFlatUpdateLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                       STATE_TYPE *__restrict state, idx_t count, ValidityMask &mask) {
		AggregateUnaryInput input(aggr_input_data, mask);
		auto &base_idx = input.input_idx;
		base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (!OP::IgnoreNull() || ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[base_idx], input);
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[base_idx], input);
					}
				}
			}
		}
	}